

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

file_status
ghc::filesystem::detail::status_ex
          (path *p,error_code *ec,file_status *sls,uintmax_t *sz,uintmax_t *nhl,time_t *lwt,
          int recurse_count)

{
  file_type fVar1;
  bool bVar2;
  int iVar3;
  file_status fVar4;
  file_type *pfVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  undefined4 in_stack_0000000c;
  stat local_c0;
  
  fVar4 = (file_status)std::_V2::system_category();
  sls->_type = none;
  sls[1] = fVar4;
  iVar3 = lstat(*(char **)ec,&local_c0);
  if (iVar3 == 0) {
    sls->_type = none;
    sls[1] = fVar4;
    uVar6 = (local_c0.st_mode & 0xf000) - 0x1000 >> 0xc;
    switch(uVar6) {
    case 0:
      uVar6 = 7;
      break;
    case 1:
      uVar6 = 6;
      break;
    default:
      uVar6 = 9;
      break;
    case 3:
    case 5:
      break;
    case 7:
      uVar6 = 2;
      break;
    case 9:
      uVar6 = 4;
      bVar2 = true;
      goto LAB_0011f25e;
    case 0xb:
      uVar6 = 8;
    }
    bVar2 = false;
LAB_0011f25e:
    uVar8 = (ushort)local_c0.st_mode & 0xfff;
    if (sz != (uintmax_t *)0x0) {
      *(uint *)sz = uVar6;
      *(ushort *)((long)sz + 4) = uVar8;
    }
    if (bVar2) {
      iVar3 = stat(*(char **)ec,&local_c0);
      if (iVar3 != 0) goto LAB_0011f1c9;
      uVar7 = (local_c0.st_mode & 0xf000) - 0x1000;
      uVar6 = 9;
      if (uVar7 < 0xc000) {
        uVar6 = *(uint *)(&DAT_00145280 + (uVar7 >> 10));
      }
      uVar8 = (ushort)local_c0.st_mode & 0xfff;
    }
    if (nhl != (uintmax_t *)0x0) {
      *nhl = local_c0.st_size;
    }
    if (lwt != (time_t *)0x0) {
      *lwt = local_c0.st_nlink;
    }
    if ((__time_t *)CONCAT44(in_stack_0000000c,recurse_count) != (__time_t *)0x0) {
      *(__time_t *)CONCAT44(in_stack_0000000c,recurse_count) = local_c0.st_mtim.tv_sec;
    }
  }
  else {
LAB_0011f1c9:
    pfVar5 = (file_type *)__errno_location();
    fVar1 = *pfVar5;
    sls->_type = fVar1;
    sls[1] = fVar4;
    uVar8 = 0xffff;
    uVar6 = 1;
    if ((fVar1 != regular) && (fVar1 != 0x14)) {
      uVar6 = 0;
    }
  }
  *(uint *)&(p->_path)._M_dataplus._M_p = uVar6;
  *(ushort *)((long)&(p->_path)._M_dataplus._M_p + 4) = uVar8;
  return (file_status)p;
}

Assistant:

GHC_INLINE file_status status_ex(const path& p, std::error_code& ec, file_status* sls = nullptr, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr, int recurse_count = 0) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (recurse_count > 16) {
        ec = detail::make_system_error(0x2A9 /*ERROR_STOPPED_ON_SYMLINK*/);
        return file_status(file_type::unknown);
    }
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!::GetFileAttributesExW(GHC_NATIVEWP(p), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
        path target = resolveSymlink(p, ec);
        file_status result;
        if (!ec && !target.empty()) {
            if (sls) {
                *sls = status_from_INFO(p, &attr, ec);
            }
            return detail::status_ex(target, ec, nullptr, sz, nhl, lwt, recurse_count + 1);
        }
        return file_status(file_type::unknown);
    }
    if (ec) {
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found);
        }
        return file_status(file_type::none);
    }
    if (nhl) {
        *nhl = 0;
    }
    return detail::status_from_INFO(p, &attr, ec, sz, lwt);
#else
    (void)recurse_count;
    struct ::stat st;
    auto result = ::lstat(p.c_str(), &st);
    if (result == 0) {
        ec.clear();
        file_status fs = detail::file_status_from_st_mode(st.st_mode);
        if (sls) {
            *sls = fs;
        }
        if (fs.type() == file_type::symlink) {
            result = ::stat(p.c_str(), &st);
            if (result == 0) {
                fs = detail::file_status_from_st_mode(st.st_mode);
            }
            else {
                ec = detail::make_system_error();
                if (detail::is_not_found_error(ec)) {
                    return file_status(file_type::not_found, perms::unknown);
                }
                return file_status(file_type::none);
            }
        }
        if (sz) {
            *sz = static_cast<uintmax_t>(st.st_size);
        }
        if (nhl) {
            *nhl = st.st_nlink;
        }
        if (lwt) {
            *lwt = st.st_mtime;
        }
        return fs;
    }
    else {
        ec = detail::make_system_error();
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found, perms::unknown);
        }
        return file_status(file_type::none);
    }
#endif
}